

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiListClipper::End(ImGuiListClipper *this)

{
  int iVar1;
  void *pvVar2;
  ImGuiContext *pIVar3;
  ImGuiListClipperData *pIVar4;
  
  pIVar3 = GImGui;
  pvVar2 = this->TempData;
  if (pvVar2 != (void *)0x0) {
    if (((uint)this->ItemsCount < 0x7fffffff) && (-1 < this->DisplayStart)) {
      ImGuiListClipper_SeekCursorForItem(this,this->ItemsCount);
    }
    *(undefined4 *)((long)pvVar2 + 0xc) = *(undefined4 *)((long)pvVar2 + 0x18);
    iVar1 = pIVar3->ClipperTempDataStacked;
    pIVar3->ClipperTempDataStacked = iVar1 + -1;
    if (1 < (long)iVar1) {
      pIVar4 = (pIVar3->ClipperTempData).Data + (long)iVar1 + -2;
      pIVar4->ListClipper->TempData = pIVar4;
    }
    this->TempData = (void *)0x0;
  }
  this->ItemsCount = -1;
  return;
}

Assistant:

void ImGuiListClipper::End()
{
    ImGuiContext& g = *GImGui;
    if (ImGuiListClipperData* data = (ImGuiListClipperData*)TempData)
    {
        // In theory here we should assert that we are already at the right position, but it seems saner to just seek at the end and not assert/crash the user.
        if (ItemsCount >= 0 && ItemsCount < INT_MAX && DisplayStart >= 0)
            ImGuiListClipper_SeekCursorForItem(this, ItemsCount);

        // Restore temporary buffer and fix back pointers which may be invalidated when nesting
        IM_ASSERT(data->ListClipper == this);
        data->StepNo = data->Ranges.Size;
        if (--g.ClipperTempDataStacked > 0)
        {
            data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
            data->ListClipper->TempData = data;
        }
        TempData = NULL;
    }
    ItemsCount = -1;
}